

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O3

Vector<double,_2> __thiscall
tcu::faceForward<double,2>
          (tcu *this,Vector<double,_2> *n,Vector<double,_2> *i,Vector<double,_2> *ref)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  double res;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Vector<double,_2> VVar9;
  
  dVar6 = 0.0;
  lVar5 = 0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    dVar6 = dVar6 + ref->m_data[lVar5] * i->m_data[lVar5];
    lVar5 = 1;
    bVar2 = false;
  } while (bVar4);
  uVar3 = (uint)(dVar6 < 0.0);
  auVar8._0_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar8._4_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar8._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar8._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar7 = *(undefined1 (*) [16])n->m_data & auVar8;
  dVar6 = SUB168(*(undefined1 (*) [16])n->m_data,0);
  auVar1._8_4_ = SUB84(n->m_data[1],0);
  auVar1._0_8_ = -dVar6;
  auVar1._12_4_ = (uint)((ulong)n->m_data[1] >> 0x20) ^ 0x80000000;
  *(undefined1 (*) [16])this = ~auVar8 & auVar1 | auVar7;
  VVar9.m_data[0] = auVar7._0_8_;
  VVar9.m_data[1] = -dVar6;
  return (Vector<double,_2>)VVar9.m_data;
}

Assistant:

inline Vector<T, Size> faceForward (const Vector<T, Size>& n, const Vector<T, Size>& i, const Vector<T, Size>& ref)
{
	return (dot(ref, i) < T(0)) ? n: -n;
}